

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generators.cpp
# Opt level: O0

void __thiscall
flatbuffers::TypedFloatConstantGenerator::TypedFloatConstantGenerator
          (TypedFloatConstantGenerator *this,char *double_prefix,char *single_prefix,
          char *nan_number,char *pos_inf_number,char *neg_inf_number)

{
  char *pcVar1;
  allocator<char> local_50;
  allocator<char> local_4f;
  allocator<char> local_4e;
  allocator<char> local_4d [20];
  allocator<char> local_39;
  char *local_38;
  char *neg_inf_number_local;
  char *pos_inf_number_local;
  char *nan_number_local;
  char *single_prefix_local;
  char *double_prefix_local;
  TypedFloatConstantGenerator *this_local;
  
  local_38 = neg_inf_number;
  neg_inf_number_local = pos_inf_number;
  pos_inf_number_local = nan_number;
  nan_number_local = single_prefix;
  single_prefix_local = double_prefix;
  double_prefix_local = (char *)this;
  FloatConstantGenerator::FloatConstantGenerator(&this->super_FloatConstantGenerator);
  pcVar1 = single_prefix_local;
  (this->super_FloatConstantGenerator)._vptr_FloatConstantGenerator =
       (_func_int **)&PTR__TypedFloatConstantGenerator_0032cc60;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->double_prefix_,pcVar1,&local_39);
  std::allocator<char>::~allocator(&local_39);
  pcVar1 = nan_number_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->single_prefix_,pcVar1,local_4d);
  std::allocator<char>::~allocator(local_4d);
  pcVar1 = pos_inf_number_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->nan_number_,pcVar1,&local_4e);
  std::allocator<char>::~allocator(&local_4e);
  pcVar1 = neg_inf_number_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->pos_inf_number_,pcVar1,&local_4f);
  std::allocator<char>::~allocator(&local_4f);
  pcVar1 = local_38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->neg_inf_number_,pcVar1,&local_50);
  std::allocator<char>::~allocator(&local_50);
  return;
}

Assistant:

TypedFloatConstantGenerator::TypedFloatConstantGenerator(
    const char *double_prefix, const char *single_prefix,
    const char *nan_number, const char *pos_inf_number,
    const char *neg_inf_number)
    : double_prefix_(double_prefix),
      single_prefix_(single_prefix),
      nan_number_(nan_number),
      pos_inf_number_(pos_inf_number),
      neg_inf_number_(neg_inf_number) {}